

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicExpression<mp::LinTerms>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *cc,ItemNamer *vnam
               )

{
  char *__s;
  size_t sVar1;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  __s = ItemNamer::at(vnam,(long)cc->compl_var_);
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  value_00.size_ = 0xd;
  value_00.data_ = " complements ";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms,mp::ItemNamer>
            (wrt,&cc->compl_expr_,vnam);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ComplementarityConstraint<Expr>& cc,
                    ItemNamer& vnam) {
  wrt << vnam.at(cc.GetVariable());
  wrt << " complements ";
  WriteModelItem(wrt, cc.GetExpression(), vnam);
}